

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

void __thiscall
QDirPrivate::QDirPrivate
          (QDirPrivate *this,QString *path,QStringList *nameFilters_,SortFlags sort_,
          Filters filters_)

{
  long lVar1;
  QByteArrayView ba;
  QByteArrayView ba_00;
  bool bVar2;
  const_iterator cVar3;
  const_iterator this_00;
  undefined4 in_ECX;
  QDirPrivate *in_RDX;
  FileCache *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  bool empty;
  anon_class_1_0_00000001 isEmpty;
  QList<QString> *in_stack_ffffffffffffff38;
  char (*in_stack_ffffffffffffff48) [2];
  QByteArrayView *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar4;
  storage_type *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSharedData::QSharedData((QSharedData *)0x184c89);
  QList<QString>::QList((QList<QString> *)in_RDI,in_stack_ffffffffffffff38);
  *(undefined4 *)&(in_RDI->fileInfos).d.d = in_ECX;
  *(undefined4 *)((long)&(in_RDI->fileInfos).d.d + 4) = in_R8D;
  std::unique_ptr<QAbstractFileEngine,std::default_delete<QAbstractFileEngine>>::
  unique_ptr<std::default_delete<QAbstractFileEngine>,void>
            ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)in_RDI);
  QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)in_RDI);
  FileCache::FileCache(in_RDI);
  bVar2 = QString::isEmpty((QString *)0x184ce4);
  if (bVar2) {
    QByteArrayView::QByteArrayView<2ul>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    ba.m_size._7_1_ = in_stack_ffffffffffffffc7;
    ba.m_size._0_7_ = in_stack_ffffffffffffffc0;
    ba.m_data = in_stack_ffffffffffffffc8;
    QString::fromLatin1(ba);
  }
  else {
    QString::QString((QString *)in_RDI,(QString *)in_stack_ffffffffffffff38);
  }
  setPath(in_RDX,(QString *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  QString::~QString((QString *)0x184d4e);
  uVar4 = 0xaa;
  cVar3 = QList<QString>::cbegin((QList<QString> *)in_RDI);
  this_00 = QList<QString>::cend((QList<QString> *)in_RDI);
  bVar2 = std::
          all_of<QList<QString>::const_iterator,QDirPrivate::QDirPrivate(QString_const&,QList<QString>const&,QFlags<QDir::SortFlag>,QFlags<QDir::Filter>)::__0>
                    (cVar3.i,this_00.i);
  if (bVar2) {
    QByteArrayView::QByteArrayView<2ul>((QByteArrayView *)this_00.i,in_stack_ffffffffffffff48);
    ba_00.m_size._7_1_ = uVar4;
    ba_00.m_size._0_7_ = in_stack_ffffffffffffffc0;
    ba_00.m_data = in_stack_ffffffffffffffc8;
    QString::fromLatin1(ba_00);
    QList<QString>::QList<QString,void>
              ((QList<QString> *)in_RDI,(QString *)in_stack_ffffffffffffff38);
    QList<QString>::operator=((QList<QString> *)in_RDI,in_stack_ffffffffffffff38);
    QList<QString>::~QList((QList<QString> *)0x184dee);
    QString::~QString((QString *)0x184df8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDirPrivate::QDirPrivate(const QString &path, const QStringList &nameFilters_,
                         QDir::SortFlags sort_, QDir::Filters filters_)
    : QSharedData(), nameFilters(nameFilters_), sort(sort_), filters(filters_)
{
    setPath(path.isEmpty() ? QString::fromLatin1(".") : path);

    auto isEmpty = [](const auto &e) { return e.isEmpty(); };
    const bool empty = std::all_of(nameFilters.cbegin(), nameFilters.cend(), isEmpty);
    if (empty)
        nameFilters = QStringList(QString::fromLatin1("*"));
}